

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::MatrixAccumulator::getStdDev(MatrixAccumulator *this,ResultType *ret)

{
  uint j;
  long lVar1;
  SquareMatrix<double,_3> *pSVar2;
  uint i;
  long lVar3;
  double dVar4;
  Mat3x3d var;
  SquareMatrix<double,_3> local_68;
  
  pSVar2 = &local_68;
  SquareMatrix<double,_3>::SquareMatrix(&local_68);
  getVariance(this,(ResultType *)&local_68);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      dVar4 = *(double *)((long)pSVar2 + lVar1 * 8);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar1] = dVar4;
    }
    pSVar2 = (SquareMatrix<double,_3> *)((long)pSVar2 + 0x18);
    ret = (ResultType *)((long)ret + 0x18);
  }
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d var;
      this->getVariance(var);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = sqrt(var(i, j));
        }
      }
      return;
    }